

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11GlxPlatform.cpp
# Opt level: O2

void __thiscall tcu::x11::glx::GlxWindow::getDimensions(GlxWindow *this,int *width,int *height)

{
  uint uVar1;
  
  if (width != (int *)0x0) {
    uVar1 = GlxDrawable::getAttrib(&this->super_GlxDrawable,0x801d);
    *width = uVar1;
  }
  if (height != (int *)0x0) {
    uVar1 = GlxDrawable::getAttrib(&this->super_GlxDrawable,0x801e);
    *height = uVar1;
  }
  if (((width == (int *)0x0) || (*width != 0)) && ((height == (int *)0x0 || (*height != 0)))) {
    return;
  }
  XlibWindow::getDimensions(&this->m_x11Window,width,height);
  return;
}

Assistant:

void GlxWindow::getDimensions (int* width, int* height)
{
	if (width != DE_NULL)
		*width = getAttrib(GLX_WIDTH);
	if (height != DE_NULL)
		*height = getAttrib(GLX_HEIGHT);

	// glXQueryDrawable may be buggy, so fall back to X geometry if needed
	if ((width != DE_NULL && *width == 0) || (height != DE_NULL && *height == 0))
		m_x11Window.getDimensions(width, height);
}